

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void session_sched_reschedule_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  nghttp2_pq *pq_00;
  size_t sVar4;
  int rv;
  uint64_t penalty;
  int inc;
  uint32_t urgency;
  nghttp2_pq *pq;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  uVar2 = stream->extpri & 0xffffff7f;
  sVar1 = stream->last_writelen;
  if (7 < uVar2) {
    __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x430,"void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)"
                 );
  }
  pq_00 = &session->sched[uVar2].ob_data;
  if (((stream->extpri & 0x80) != 0) && (sVar4 = nghttp2_pq_size(pq_00), sVar4 != 1)) {
    nghttp2_pq_remove(pq_00,&stream->pq_entry);
    stream->cycle = sVar1 + stream->cycle;
    iVar3 = nghttp2_pq_push(pq_00,&stream->pq_entry);
    if (iVar3 != 0) {
      __assert_fail("0 == rv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x43e,
                    "void session_sched_reschedule_stream(nghttp2_session *, nghttp2_stream *)");
    }
  }
  return;
}

Assistant:

static void session_sched_reschedule_stream(nghttp2_session *session,
                                            nghttp2_stream *stream) {
  nghttp2_pq *pq;
  uint32_t urgency = nghttp2_extpri_uint8_urgency(stream->extpri);
  int inc = nghttp2_extpri_uint8_inc(stream->extpri);
  uint64_t penalty = (uint64_t)stream->last_writelen;
  int rv;

  (void)rv;

  assert(urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS);

  pq = &session->sched[urgency].ob_data;

  if (!inc || nghttp2_pq_size(pq) == 1) {
    return;
  }

  nghttp2_pq_remove(pq, &stream->pq_entry);

  stream->cycle += penalty;

  rv = nghttp2_pq_push(pq, &stream->pq_entry);

  assert(0 == rv);
}